

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O3

bool __thiscall QSslSocketPrivate::flush(QSslSocketPrivate *this)

{
  TlsCryptograph *pTVar1;
  bool bVar2;
  
  if ((this->mode != UnencryptedMode) &&
     (pTVar1 = (this->backend)._M_t.
               super___uniq_ptr_impl<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
               ._M_t.
               super__Tuple_impl<0UL,_QTlsPrivate::TlsCryptograph_*,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
               .super__Head_base<0UL,_QTlsPrivate::TlsCryptograph_*,_false>._M_head_impl,
     pTVar1 != (TlsCryptograph *)0x0)) {
    (**(code **)(*(long *)pTVar1 + 200))();
  }
  if (this->plainSocket != (QTcpSocket *)0x0) {
    bVar2 = QAbstractSocket::flush(&this->plainSocket->super_QAbstractSocket);
    return bVar2;
  }
  return false;
}

Assistant:

bool QSslSocketPrivate::flush()
{
#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocketPrivate::flush()";
#endif
    if (mode != QSslSocket::UnencryptedMode) {
        // encrypt any unencrypted bytes in our buffer
        transmit();
    }

    return plainSocket && plainSocket->flush();
}